

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Cord __thiscall
google::protobuf::Reflection::GetCord(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int number;
  CppStringType CVar3;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  Cord **ppCVar6;
  Cord *src;
  InlinedStringField *this_01;
  MicroString *this_02;
  ArenaStringPtr *this_03;
  string *psVar7;
  FieldDescriptor *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar8;
  string_view sVar9;
  Cord CVar10;
  string_view local_80;
  ArenaStringPtr *str;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar4 = Message::GetReflection((Message *)field);
  if ((Reflection *)message != pRVar4) {
    pDVar5 = (Descriptor *)(message->super_MessageLite)._vptr_MessageLite;
    actual = Message::GetDescriptor((Message *)field);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,actual,in_RCX,"GetCord");
  }
  pDVar5 = FieldDescriptor::containing_type(in_RCX);
  if (pDVar5 != (Descriptor *)(message->super_MessageLite)._vptr_MessageLite) {
    anon_unknown_6::ReportReflectionUsageError
              ((Descriptor *)(message->super_MessageLite)._vptr_MessageLite,in_RCX,"GetCord",
               "Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(in_RCX);
  if (bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              ((Descriptor *)(message->super_MessageLite)._vptr_MessageLite,in_RCX,"GetCord",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(in_RCX);
  if (CVar2 != CPPTYPE_STRING) {
    anon_unknown_6::ReportReflectionUsageTypeError
              ((Descriptor *)(message->super_MessageLite)._vptr_MessageLite,in_RCX,"GetCord",
               CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension(in_RCX);
  if (bVar1) {
    this_00 = GetExtensionSet((Reflection *)message,(Message *)field);
    number = FieldDescriptor::number(in_RCX);
    psVar7 = internal::DefaultValueStringAsString_abi_cxx11_(in_RCX);
    psVar7 = internal::ExtensionSet::GetString(this_00,number,psVar7);
    sVar9 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
    absl::lts_20250127::Cord::Cord((Cord *)this,sVar9);
    uVar8 = extraout_RDX;
  }
  else {
    bVar1 = internal::ReflectionSchema::InRealOneof
                      ((ReflectionSchema *)&(message->super_MessageLite)._internal_metadata_,in_RCX)
    ;
    if ((!bVar1) || (bVar1 = HasOneofField((Reflection *)message,(Message *)field,in_RCX), bVar1)) {
      CVar3 = FieldDescriptor::cpp_string_type(in_RCX);
      if (CVar3 != kView) {
        if (CVar3 == kCord) {
          bVar1 = internal::ReflectionSchema::InRealOneof
                            ((ReflectionSchema *)&(message->super_MessageLite)._internal_metadata_,
                             in_RCX);
          if (bVar1) {
            ppCVar6 = GetField<absl::lts_20250127::Cord*>
                                ((Reflection *)message,(Message *)field,in_RCX);
            absl::lts_20250127::Cord::Cord((Cord *)this,*ppCVar6);
            uVar8 = extraout_RDX_01;
          }
          else {
            src = GetField<absl::lts_20250127::Cord>((Reflection *)message,(Message *)field,in_RCX);
            absl::lts_20250127::Cord::Cord((Cord *)this,src);
            uVar8 = extraout_RDX_02;
          }
          goto LAB_00306c94;
        }
        if (CVar3 != kString) {
          internal::Unreachable
                    ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x7d3);
        }
      }
      bVar1 = IsInlined((Reflection *)message,in_RCX);
      if (bVar1) {
        this_01 = GetField<google::protobuf::internal::InlinedStringField>
                            ((Reflection *)message,(Message *)field,in_RCX);
        psVar7 = internal::InlinedStringField::GetNoArena_abi_cxx11_(this_01);
        sVar9 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
        absl::lts_20250127::Cord::Cord((Cord *)this,sVar9);
        uVar8 = extraout_RDX_03;
      }
      else {
        bVar1 = IsMicroString((Reflection *)message,in_RCX);
        if (bVar1) {
          this_02 = GetField<google::protobuf::internal::MicroString>
                              ((Reflection *)message,(Message *)field,in_RCX);
          sVar9 = internal::MicroString::Get(this_02);
          absl::lts_20250127::Cord::Cord((Cord *)this,sVar9);
          uVar8 = extraout_RDX_04;
        }
        else {
          this_03 = GetField<google::protobuf::internal::ArenaStringPtr>
                              ((Reflection *)message,(Message *)field,in_RCX);
          bVar1 = internal::ArenaStringPtr::IsDefault(this_03);
          if (bVar1) {
            local_80 = FieldDescriptor::default_value_string(in_RCX);
          }
          else {
            psVar7 = internal::ArenaStringPtr::Get_abi_cxx11_(this_03);
            local_80 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
          }
          absl::lts_20250127::Cord::Cord((Cord *)this,local_80);
          uVar8 = extraout_RDX_05;
        }
      }
    }
    else {
      sVar9 = FieldDescriptor::default_value_string(in_RCX);
      absl::lts_20250127::Cord::Cord((Cord *)this,sVar9);
      uVar8 = extraout_RDX_00;
    }
  }
LAB_00306c94:
  CVar10.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)uVar8;
  CVar10.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar10.contents_.data_.rep_.field_0;
}

Assistant:

absl::Cord Reflection::GetCord(const Message& message,
                               const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetCord, SINGULAR, STRING);
  if (field->is_extension()) {
    return absl::Cord(GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field)));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return absl::Cord(field->default_value_string());
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          return *GetField<absl::Cord*>(message, field);
        } else {
          return GetField<absl::Cord>(message, field);
        }
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return absl::Cord(
              GetField<InlinedStringField>(message, field).GetNoArena());
        } else if (IsMicroString(field)) {
          return absl::Cord(GetField<MicroString>(message, field).Get());
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return absl::Cord(str.IsDefault() ? field->default_value_string()
                                            : str.Get());
        }
    }
    internal::Unreachable();
  }
}